

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifsit(bifcxdef *ctx,int argc)

{
  runsdef **pprVar1;
  uchar uVar2;
  voccxdef *pvVar3;
  runsdef *prVar4;
  ushort *puVar5;
  objnum oVar6;
  runcxdef *prVar7;
  long lVar8;
  int iVar9;
  uint siz;
  uchar *lst;
  uint local_2c;
  ushort *local_28;
  
  prVar7 = ctx->bifcxrun;
  pvVar3 = prVar7->runcxvoc;
  prVar4 = prVar7->runcxsp + -1;
  uVar2 = prVar7->runcxsp[-1].runstyp;
  if (argc == 2) {
    prVar7->runcxsp = prVar4;
    oVar6 = 0xffff;
    if (uVar2 != '\x05') {
      prVar7 = ctx->bifcxrun;
      if (prVar4->runstyp != '\x02') {
LAB_0012423a:
        prVar7->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x3f2);
      }
      oVar6 = (prVar7->runcxsp->runsv).runsvobj;
    }
    prVar4 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar4 + -1;
    if (prVar4[-1].runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    iVar9 = *(int *)&ctx->bifcxrun->runcxsp->runsv;
    pvVar3->voccxthc = 0;
    if (iVar9 == 2) {
      pvVar3->voccxher = oVar6;
    }
    else if (iVar9 == 1) {
      pvVar3->voccxhim = oVar6;
    }
    else if (iVar9 == 0) {
      pvVar3->voccxit = oVar6;
    }
  }
  else {
    if (uVar2 == '\x05') {
      pvVar3->voccxit = 0xffff;
      pprVar1 = &ctx->bifcxrun->runcxsp;
      *pprVar1 = *pprVar1 + -1;
    }
    else {
      if (uVar2 == '\a') {
        prVar7->runcxsp = prVar4;
        if (prVar4->runstyp == '\a') {
          puVar5 = (ushort *)(ctx->bifcxrun->runcxsp->runsv).runsvstr;
          local_28 = puVar5 + 1;
          iVar9 = 0;
          local_2c = *puVar5 - 2;
          if (local_2c != 0) {
            do {
              if ((char)*local_28 == '\x02') {
                lVar8 = (long)iVar9;
                iVar9 = iVar9 + 1;
                pvVar3->voccxthm[lVar8] = *(objnum *)((long)local_28 + 1);
              }
              lstadv((uchar **)&local_28,&local_2c);
            } while (local_2c != 0);
          }
          pvVar3->voccxthc = (objnum)iVar9;
          pvVar3->voccxit = 0xffff;
          return;
        }
        ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x3fc);
      }
      prVar7->runcxsp = prVar4;
      prVar7 = ctx->bifcxrun;
      if (prVar4->runstyp != '\x02') goto LAB_0012423a;
      pvVar3->voccxit = (prVar7->runcxsp->runsv).runsvobj;
    }
    pvVar3->voccxthc = 0;
  }
  return;
}

Assistant:

void bifsit(bifcxdef *ctx, int argc)
{
    objnum    obj;
    int       typ;
    voccxdef *vcx = ctx->bifcxrun->runcxvoc;
    
    /* check for extended version that allows setting him/her */
    if (argc == 2)
    {
        if (runtostyp(ctx->bifcxrun) == DAT_NIL)
        {
            rundisc(ctx->bifcxrun);                      /* discard the nil */
            obj = MCMONINV;                           /* use invalid object */
        }
        else
            obj = runpopobj(ctx->bifcxrun);               /* get the object */

        typ = runpopnum(ctx->bifcxrun);                     /* get the code */
        vcx->voccxthc = 0;                         /* clear the 'them' list */

        switch(typ)
        {
        case 0:                                                 /* set "it" */
            vcx->voccxit = obj;
            break;

        case 1:                                                /* set "him" */
            vcx->voccxhim = obj;
            break;

        case 2:                                                /* set "her" */
            vcx->voccxher = obj;
            break;
        }
        return;
    }

    /* "setit classic" has one argument only */
    bifcntargs(ctx, 1, argc);

    /* check to see if we're setting 'it' or 'them' */
    if (runtostyp(ctx->bifcxrun) == DAT_LIST)
    {
        uchar *lst;
        uint   siz;
        int    cnt;

        lst = runpoplst(ctx->bifcxrun);
        siz = osrp2(lst);
        lst += 2;
        siz -= 2;

        for (cnt = 0 ; siz ; )
        {
            /* if this is an object, add to 'them' list (otherwise ignore) */
            if (*lst == DAT_OBJECT)
                vcx->voccxthm[cnt++] = osrp2(lst+1);

            lstadv(&lst, &siz);
        }
        vcx->voccxthc = cnt;
        vcx->voccxit = MCMONINV;
    }
    else
    {
        /* set 'it', and delete 'them' list */
        if (runtostyp(ctx->bifcxrun) == DAT_NIL)
        {
            vcx->voccxit = MCMONINV;
            rundisc(ctx->bifcxrun);
        }
        else
            vcx->voccxit = runpopobj(ctx->bifcxrun);
        vcx->voccxthc = 0;
    }
}